

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

int __thiscall CPU::instrLDA0xb5(CPU *this)

{
  uint8_t argument;
  CPU *in_RDI;
  
  argument = zeropage_x_addr(in_RDI);
  LDA(in_RDI,argument);
  return 4;
}

Assistant:

int CPU::instrLDA0xb5() {
	LDA(zeropage_x_addr());
	return 4;
}